

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ping-pong.c
# Opt level: O0

void pipe_pinger_new(int vectored_writes)

{
  int iVar1;
  int *piVar2;
  uv_loop_t *loop;
  pinger_t *pinger;
  int r;
  int vectored_writes_local;
  
  piVar2 = (int *)malloc(0x2978);
  if (piVar2 == (int *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ping-pong.c"
            ,0xeb,"pinger != NULL");
    abort();
  }
  *piVar2 = vectored_writes;
  piVar2[2] = 0;
  piVar2[1] = 0;
  loop = uv_default_loop();
  iVar1 = uv_pipe_init(loop,(uv_pipe_t *)(piVar2 + 4),0);
  *(int **)(piVar2 + 4) = piVar2;
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ping-pong.c"
            ,0xf3,"!r");
    abort();
  }
  uv_pipe_connect((uv_connect_t *)(piVar2 + 0x46),(uv_pipe_t *)(piVar2 + 4),"/tmp/uv-test-sock",
                  pinger_on_connect);
  if (pinger_on_connect_count != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-ping-pong.c"
            ,0xfb,"pinger_on_connect_count == 0");
    abort();
  }
  return;
}

Assistant:

static void pipe_pinger_new(int vectored_writes) {
  int r;
  pinger_t *pinger;

  pinger = (pinger_t*)malloc(sizeof(*pinger));
  ASSERT(pinger != NULL);
  pinger->vectored_writes = vectored_writes;
  pinger->state = 0;
  pinger->pongs = 0;

  /* Try to connect to the server and do NUM_PINGS ping-pongs. */
  r = uv_pipe_init(uv_default_loop(), &pinger->stream.pipe, 0);
  pinger->stream.pipe.data = pinger;
  ASSERT(!r);

  /* We are never doing multiple reads/connects at a time anyway, so these
   * handles can be pre-initialized. */
  uv_pipe_connect(&pinger->connect_req, &pinger->stream.pipe, TEST_PIPENAME,
      pinger_on_connect);

  /* Synchronous connect callbacks are not allowed. */
  ASSERT(pinger_on_connect_count == 0);
}